

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O1

bool duckdb::ExpressionBinder::ContainsType(LogicalType *type,LogicalTypeId target)

{
  bool bVar1;
  idx_t iVar2;
  LogicalType *pLVar3;
  idx_t iVar4;
  
  do {
    if (type->id_ == target) {
      return true;
    }
    switch(type->id_) {
    case STRUCT:
      iVar2 = StructType::GetChildCount(type);
      if (iVar2 == 0) {
        return iVar2 != 0;
      }
      iVar4 = 0;
      do {
        pLVar3 = StructType::GetChildType(type,iVar4);
        bVar1 = ContainsType(pLVar3,target);
        if (bVar1) {
          return true;
        }
        iVar4 = iVar4 + 1;
      } while (iVar2 != iVar4);
      return false;
    case LIST:
    case MAP:
      type = ListType::GetChildType(type);
      break;
    default:
      return false;
    case UNION:
      iVar2 = UnionType::GetMemberCount(type);
      if (iVar2 == 0) {
        return iVar2 != 0;
      }
      iVar4 = 0;
      do {
        pLVar3 = UnionType::GetMemberType(type,iVar4);
        bVar1 = ContainsType(pLVar3,target);
        if (bVar1) {
          return true;
        }
        iVar4 = iVar4 + 1;
      } while (iVar2 != iVar4);
      return false;
    case ARRAY:
      type = ArrayType::GetChildType(type);
    }
  } while( true );
}

Assistant:

bool ExpressionBinder::ContainsType(const LogicalType &type, LogicalTypeId target) {
	if (type.id() == target) {
		return true;
	}
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		auto child_count = StructType::GetChildCount(type);
		for (idx_t i = 0; i < child_count; i++) {
			if (ContainsType(StructType::GetChildType(type, i), target)) {
				return true;
			}
		}
		return false;
	}
	case LogicalTypeId::UNION: {
		auto member_count = UnionType::GetMemberCount(type);
		for (idx_t i = 0; i < member_count; i++) {
			if (ContainsType(UnionType::GetMemberType(type, i), target)) {
				return true;
			}
		}
		return false;
	}
	case LogicalTypeId::LIST:
	case LogicalTypeId::MAP:
		return ContainsType(ListType::GetChildType(type), target);
	case LogicalTypeId::ARRAY:
		return ContainsType(ArrayType::GetChildType(type), target);
	default:
		return false;
	}
}